

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O3

string * __thiscall
mp::SolverOption::echo_with_value_abi_cxx11_(string *__return_storage_ptr__,SolverOption *this)

{
  undefined **ppuVar1;
  int iVar2;
  undefined **local_250;
  undefined ***local_248;
  undefined **local_240;
  undefined2 *local_238;
  undefined8 local_230;
  ulong local_228;
  undefined2 local_220;
  undefined1 local_21e;
  
  (*this->_vptr_SolverOption[0xe])();
  iVar2 = (*this->_vptr_SolverOption[2])(this);
  if ((char)iVar2 == '\0') {
    local_248 = &local_240;
    local_250 = &PTR__BasicMemoryWriter_00445660;
    local_228 = 500;
    local_240 = &PTR_grow_004456a8;
    local_220 = 0x3d20;
    local_21e = 0x20;
    local_230 = 3;
    local_238 = &local_220;
    (*this->_vptr_SolverOption[0xc])(this,&local_250);
    ppuVar1 = local_248[2];
    if (local_248[3] < (undefined **)((long)ppuVar1 + 1U)) {
      (*(code *)**local_248)();
    }
    *(undefined1 *)((long)local_248[1] + (long)ppuVar1) = 0;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_250 = &PTR__BasicMemoryWriter_00445660;
    local_240 = &PTR_grow_004456a8;
    if (local_238 != &local_220) {
      operator_delete(local_238,local_228);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string echo_with_value() {
    auto s = echo();
    if (!is_flag()) {
      fmt::MemoryWriter w;
      w << " = ";
      this->Write(w);
      s += w.c_str();
    }
    return s;
  }